

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::_q_yearClicked(QCalendarWidgetPrivate *this)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  int ax;
  int ay;
  int aw;
  FocusPolicy FVar2;
  QWidget *this_01;
  
  this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QWidget *)this->yearEdit;
  ax = QWidget::x((QWidget *)this->yearButton);
  ay = QWidget::y((QWidget *)this->yearButton);
  aw = (**(code **)(*(long *)&(this->yearEdit->super_QAbstractSpinBox).super_QWidget + 0x70))();
  pQVar1 = (this->yearButton->super_QToolButton).super_QAbstractButton.super_QWidget.data;
  QWidget::setGeometry(this_00,ax,ay,aw,((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1);
  pQVar1 = (this->yearButton->super_QToolButton).super_QAbstractButton.super_QWidget.data;
  QSpacerItem::changeSize
            (this->spaceHolder,((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1,0,Minimum,
             Minimum);
  QWidget::hide((QWidget *)this->yearButton);
  FVar2 = QWidget::focusPolicy(this_01);
  this->oldFocusPolicy = FVar2;
  QWidget::setFocusPolicy(this_01,NoFocus);
  QWidget::show((QWidget *)this->yearEdit);
  QObject::installEventFilter(QCoreApplication::self);
  QWidget::raise((QWidget *)this->yearEdit,(int)this_01);
  QAbstractSpinBox::selectAll((QAbstractSpinBox *)this->yearEdit);
  QWidget::setFocus((QWidget *)this->yearEdit,MouseFocusReason);
  return;
}

Assistant:

void QCalendarWidgetPrivate::_q_yearClicked()
{
    Q_Q(QCalendarWidget);
    //show the spinbox on top of the button
    yearEdit->setGeometry(yearButton->x(), yearButton->y(),
                          yearEdit->sizeHint().width(), yearButton->height());
    spaceHolder->changeSize(yearButton->width(), 0);
    yearButton->hide();
    oldFocusPolicy = q->focusPolicy();
    q->setFocusPolicy(Qt::NoFocus);
    yearEdit->show();
    qApp->installEventFilter(q);
    yearEdit->raise();
    yearEdit->selectAll();
    yearEdit->setFocus(Qt::MouseFocusReason);
}